

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O3

ON_BrepEdge * __thiscall
ON_Brep::NewEdge(ON_Brep *this,ON_BrepVertex *v0,ON_BrepVertex *v1,int c3i,ON_Interval *edomain,
                double edge_tolerance)

{
  bool bVar1;
  ON_BrepEdge *this_00;
  ON_Interval edom;
  ON_Interval local_48;
  ON_Interval local_38;
  
  this_00 = NewEdge(this,c3i);
  this_00->m_vi[0] = v0->m_vertex_index;
  this_00->m_vi[1] = v1->m_vertex_index;
  ON_SimpleArray<int>::Append(&v0->m_ei,&this_00->m_edge_index);
  ON_SimpleArray<int>::Append(&v1->m_ei,&this_00->m_edge_index);
  if (edomain != (ON_Interval *)0x0) {
    bVar1 = ON_Interval::IsIncreasing(edomain);
    if (bVar1) {
      ON_Interval::ON_Interval(&local_48);
      local_38 = ON_CurveProxy::ProxyCurveDomain(&this_00->super_ON_CurveProxy);
      ON_Interval::Intersection(&local_48,&local_38,edomain);
      bVar1 = ON_Interval::IsIncreasing(&local_48);
      if (bVar1) {
        ON_CurveProxy::SetProxyCurveDomain(&this_00->super_ON_CurveProxy,local_48);
      }
    }
  }
  this_00->m_tolerance = edge_tolerance;
  return this_00;
}

Assistant:

ON_BrepEdge& 
ON_Brep::NewEdge( ON_BrepVertex& v0, ON_BrepVertex& v1, 
                  int c3i, const ON_Interval* edomain,
                  double edge_tolerance )
{
  ON_BrepEdge& edge = NewEdge(c3i);
  edge.m_vi[0] = v0.m_vertex_index;
  edge.m_vi[1] = v1.m_vertex_index;
  v0.m_ei.Append(edge.m_edge_index);
  v1.m_ei.Append(edge.m_edge_index);
  if ( edomain && edomain->IsIncreasing() ) {
    ON_Interval edom;
    edom.Intersection( edge.ProxyCurveDomain(), *edomain );
    if ( edom.IsIncreasing() )
      edge.SetProxyCurveDomain(edom);
  }
  edge.m_tolerance = edge_tolerance;
  return edge;
}